

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O1

box3f * __thiscall
pbrt::TriangleMesh::getPrimBounds
          (box3f *__return_storage_ptr__,TriangleMesh *this,size_t primID,affine3f *xfm)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  pointer pvVar17;
  pointer pvVar18;
  undefined8 uVar19;
  float fVar20;
  float fVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  float fVar25;
  float fVar26;
  undefined1 auVar27 [16];
  float fVar28;
  undefined1 auVar29 [16];
  float fVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  
  (__return_storage_ptr__->lower).x = 3.4028235e+38;
  (__return_storage_ptr__->lower).y = 3.4028235e+38;
  *(undefined8 *)&(__return_storage_ptr__->lower).z = 0xff7fffff7f7fffff;
  auVar23 = _DAT_0014a350;
  uVar19 = DAT_0014a350;
  (__return_storage_ptr__->upper).y = (float)(int)uVar19;
  (__return_storage_ptr__->upper).z = (float)(int)((ulong)uVar19 >> 0x20);
  pvVar17 = (this->vertex).super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pvVar18 = (this->index).super__Vector_base<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_>.
            _M_impl.super__Vector_impl_data._M_start;
  fVar30 = pvVar17[pvVar18[primID].x].x;
  fVar1 = (xfm->l).vx.z;
  fVar20 = (xfm->l).vy.z;
  uVar3 = pvVar17[pvVar18[primID].x].y;
  uVar10 = pvVar17[pvVar18[primID].x].z;
  fVar2 = (xfm->l).vz.z;
  fVar21 = (xfm->p).z;
  fVar25 = (float)uVar10 * fVar2 + fVar30 * fVar1 + (float)uVar3 * fVar20 + fVar21;
  uVar4 = (xfm->l).vx.x;
  uVar11 = (xfm->l).vx.y;
  uVar5 = (xfm->l).vy.x;
  uVar12 = (xfm->l).vy.y;
  uVar6 = (xfm->l).vz.x;
  uVar13 = (xfm->l).vz.y;
  uVar7 = (xfm->p).x;
  uVar14 = (xfm->p).y;
  auVar32._0_8_ =
       CONCAT44((float)uVar10 * (float)uVar13 +
                (float)uVar3 * (float)uVar12 + fVar30 * (float)uVar11 + (float)uVar14,
                (float)uVar10 * (float)uVar6 + (float)uVar3 * (float)uVar5 + fVar30 * (float)uVar4 +
                (float)uVar7);
  auVar32._8_4_ = (float)uVar10 * 0.0 + (float)uVar3 * 0.0 + fVar30 * 0.0 + 0.0;
  auVar32._12_4_ = (float)uVar10 * 0.0 + (float)uVar3 * 0.0 + fVar30 * 0.0 + 0.0;
  auVar29._8_4_ = auVar32._8_4_;
  auVar29._0_8_ = auVar32._0_8_;
  auVar29._12_4_ = auVar32._12_4_;
  auVar29 = minps(auVar29,_DAT_0014e7a0);
  fVar30 = fVar25;
  if (3.4028235e+38 <= fVar25) {
    fVar30 = 3.4028235e+38;
  }
  (__return_storage_ptr__->lower).x = (float)(int)auVar29._0_8_;
  (__return_storage_ptr__->lower).y = (float)(int)((ulong)auVar29._0_8_ >> 0x20);
  (__return_storage_ptr__->lower).z = fVar30;
  auVar23 = maxps(auVar32,auVar23);
  if (fVar25 <= -3.4028235e+38) {
    fVar25 = -3.4028235e+38;
  }
  (__return_storage_ptr__->upper).x = (float)(int)auVar23._0_8_;
  (__return_storage_ptr__->upper).y = (float)(int)((ulong)auVar23._0_8_ >> 0x20);
  (__return_storage_ptr__->upper).z = fVar25;
  fVar28 = pvVar17[pvVar18[primID].y].x;
  uVar8 = pvVar17[pvVar18[primID].y].y;
  uVar15 = pvVar17[pvVar18[primID].y].z;
  fVar26 = fVar2 * (float)uVar15 + fVar1 * fVar28 + fVar20 * (float)uVar8 + fVar21;
  auVar27._0_8_ =
       CONCAT44((float)uVar15 * (float)uVar13 +
                (float)uVar8 * (float)uVar12 + fVar28 * (float)uVar11 + (float)uVar14,
                (float)uVar15 * (float)uVar6 + (float)uVar8 * (float)uVar5 + fVar28 * (float)uVar4 +
                (float)uVar7);
  auVar27._8_4_ = (float)uVar15 * 0.0 + (float)uVar8 * 0.0 + fVar28 * 0.0 + 0.0;
  auVar27._12_4_ = (float)uVar15 * 0.0 + (float)uVar8 * 0.0 + fVar28 * 0.0 + 0.0;
  auVar31._8_4_ = auVar27._8_4_;
  auVar31._0_8_ = auVar27._0_8_;
  auVar31._12_4_ = auVar27._12_4_;
  auVar32 = minps(auVar31,auVar29);
  fVar28 = fVar26;
  if (fVar30 <= fVar26) {
    fVar28 = fVar30;
  }
  (__return_storage_ptr__->lower).x = (float)(int)auVar32._0_8_;
  (__return_storage_ptr__->lower).y = (float)(int)((ulong)auVar32._0_8_ >> 0x20);
  (__return_storage_ptr__->lower).z = fVar28;
  auVar23 = maxps(auVar27,auVar23);
  if (fVar26 <= fVar25) {
    fVar26 = fVar25;
  }
  (__return_storage_ptr__->upper).x = (float)(int)auVar23._0_8_;
  (__return_storage_ptr__->upper).y = (float)(int)((ulong)auVar23._0_8_ >> 0x20);
  (__return_storage_ptr__->upper).z = fVar26;
  fVar30 = pvVar17[pvVar18[primID].z].x;
  uVar9 = pvVar17[pvVar18[primID].z].y;
  uVar16 = pvVar17[pvVar18[primID].z].z;
  fVar21 = fVar2 * (float)uVar16 + fVar1 * fVar30 + fVar20 * (float)uVar9 + fVar21;
  auVar24._0_8_ =
       CONCAT44((float)uVar16 * (float)uVar13 +
                (float)uVar9 * (float)uVar12 + fVar30 * (float)uVar11 + (float)uVar14,
                (float)uVar16 * (float)uVar6 + (float)uVar9 * (float)uVar5 + fVar30 * (float)uVar4 +
                (float)uVar7);
  auVar24._8_4_ = (float)uVar16 * 0.0 + (float)uVar9 * 0.0 + fVar30 * 0.0 + 0.0;
  auVar24._12_4_ = (float)uVar16 * 0.0 + (float)uVar9 * 0.0 + fVar30 * 0.0 + 0.0;
  auVar22._8_4_ = auVar24._8_4_;
  auVar22._0_8_ = auVar24._0_8_;
  auVar22._12_4_ = auVar24._12_4_;
  auVar32 = minps(auVar22,auVar32);
  fVar30 = fVar21;
  if (fVar28 <= fVar21) {
    fVar30 = fVar28;
  }
  (__return_storage_ptr__->lower).x = (float)(int)auVar32._0_8_;
  (__return_storage_ptr__->lower).y = (float)(int)((ulong)auVar32._0_8_ >> 0x20);
  (__return_storage_ptr__->lower).z = fVar30;
  auVar23 = maxps(auVar24,auVar23);
  if (fVar21 <= fVar26) {
    fVar21 = fVar26;
  }
  (__return_storage_ptr__->upper).x = (float)(int)auVar23._0_8_;
  (__return_storage_ptr__->upper).y = (float)(int)((ulong)auVar23._0_8_ >> 0x20);
  (__return_storage_ptr__->upper).z = fVar21;
  return __return_storage_ptr__;
}

Assistant:

box3f TriangleMesh::getPrimBounds(const size_t primID, const affine3f &xfm) 
  {
    box3f primBounds = box3f::empty_box();
    primBounds.extend(xfmPoint(xfm,vertex[index[primID].x]));
    primBounds.extend(xfmPoint(xfm,vertex[index[primID].y]));
    primBounds.extend(xfmPoint(xfm,vertex[index[primID].z]));
    return primBounds;
  }